

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_db.c
# Opt level: O2

void nhdp_db_link_set_unsymmetric(nhdp_link *lnk)

{
  list_entity *plVar1;
  uint64_t uVar2;
  list_entity *plVar3;
  
  if (lnk->status == NHDP_LINK_SYMMETRIC) {
    _link_status_not_symmetric_anymore(lnk);
  }
  oonf_timer_stop(&lnk->sym_time);
  plVar3 = (lnk->_2hop).list_head.next;
  while (plVar3->prev != (lnk->_2hop).list_head.prev) {
    plVar1 = plVar3->next;
    nhdp_db_link_2hop_remove((nhdp_l2hop *)(plVar3 + -8));
    plVar3 = plVar1;
  }
  uVar2 = oonf_clock_getNow();
  lnk->last_status_change = uVar2;
  oonf_class_event(&_link_info,lnk,OONF_OBJECT_CHANGED);
  return;
}

Assistant:

void
nhdp_db_link_set_unsymmetric(struct nhdp_link *lnk) {
  struct nhdp_l2hop *twohop, *th_it;

  if (lnk->status == NHDP_LINK_SYMMETRIC) {
    _link_status_not_symmetric_anymore(lnk);
  }

  /* stop link timers */
  oonf_timer_stop(&lnk->sym_time);

  /* remove all 2hop addresses */
  avl_for_each_element_safe(&lnk->_2hop, twohop, _link_node, th_it) {
    nhdp_db_link_2hop_remove(twohop);
  }

  /* link status was changed */
  lnk->last_status_change = oonf_clock_getNow();

  /* trigger event */
  oonf_class_event(&_link_info, lnk, OONF_OBJECT_CHANGED);
}